

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O0

PipelineResourceSignatureDescWrapper *
Diligent::PipelineStateVkImpl::GetDefaultResourceSignatureDesc
          (PipelineResourceSignatureDescWrapper *__return_storage_ptr__,TShaderStages *ShaderStages,
          char *PSOName,PipelineResourceLayoutDesc *ResourceLayout,Uint32 SRBAllocationGranularity)

{
  bool bVar1;
  Uint32 UVar2;
  reference pSVar3;
  reference ppSVar4;
  __shared_ptr_access<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this;
  char *pcVar5;
  anon_class_56_7_2d4646d5 local_f8;
  SPIRVShaderResources *local_b0;
  SPIRVShaderResources *ShaderResources;
  ShaderVkImpl *pShader;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_> *__range2;
  ShaderStageInfo *Stage;
  const_iterator __end1;
  const_iterator __begin1;
  TShaderStages *__range1;
  unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::SPIRVShaderResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::SPIRVShaderResourceAttribs_&>_>_>
  UniqueResources;
  Uint32 SRBAllocationGranularity_local;
  PipelineResourceLayoutDesc *ResourceLayout_local;
  char *PSOName_local;
  TShaderStages *ShaderStages_local;
  PipelineResourceSignatureDescWrapper *SignDesc;
  
  UniqueResources._M_h._M_single_bucket._3_1_ = 0;
  UniqueResources._M_h._M_single_bucket._4_4_ = SRBAllocationGranularity;
  ResourceLayout_local = (PipelineResourceLayoutDesc *)PSOName;
  PSOName_local = (char *)ShaderStages;
  ShaderStages_local = (TShaderStages *)__return_storage_ptr__;
  PipelineResourceSignatureDescWrapper::PipelineResourceSignatureDescWrapper
            (__return_storage_ptr__,PSOName,ResourceLayout,SRBAllocationGranularity);
  std::
  unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::SPIRVShaderResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::SPIRVShaderResourceAttribs_&>_>_>
  ::unordered_map((unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::SPIRVShaderResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::SPIRVShaderResourceAttribs_&>_>_>
                   *)&__range1);
  pcVar5 = PSOName_local;
  __end1 = std::
           vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
           ::begin((vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                    *)PSOName_local);
  Stage = (ShaderStageInfo *)
          std::
          vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
          ::end((vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                 *)pcVar5);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Diligent::PipelineStateVkImpl::ShaderStageInfo_*,_std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>_>
                                     *)&Stage), bVar1) {
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_Diligent::PipelineStateVkImpl::ShaderStageInfo_*,_std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>_>
             ::operator*(&__end1);
    __end2 = std::
             vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
             ::begin(&pSVar3->Shaders);
    pShader = (ShaderVkImpl *)
              std::
              vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
              ::end(&pSVar3->Shaders);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_Diligent::ShaderVkImpl_*const_*,_std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>_>
                                       *)&pShader), bVar1) {
      ppSVar4 = __gnu_cxx::
                __normal_iterator<const_Diligent::ShaderVkImpl_*const_*,_std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>_>
                ::operator*(&__end2);
      ShaderResources = (SPIRVShaderResources *)*ppSVar4;
      this = (__shared_ptr_access<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)ShaderVkImpl::GetShaderResources((ShaderVkImpl *)ShaderResources);
      local_f8.ShaderResources =
           std::
           __shared_ptr_access<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*(this);
      local_f8.UniqueResources =
           (unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::SPIRVShaderResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::SPIRVShaderResourceAttribs_&>_>_>
            *)&__range1;
      local_f8.pShader = (ShaderVkImpl **)&ShaderResources;
      local_f8.PSOName = (char **)&ResourceLayout_local;
      local_f8.ResourceLayout = ResourceLayout;
      local_f8.Stage = pSVar3;
      local_f8.SignDesc = __return_storage_ptr__;
      local_b0 = local_f8.ShaderResources;
      SPIRVShaderResources::
      ProcessResources<Diligent::PipelineStateVkImpl::GetDefaultResourceSignatureDesc(std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>const&,char_const*,Diligent::PipelineResourceLayoutDesc_const&,unsigned_int)::__0>
                (local_f8.ShaderResources,&local_f8);
      bVar1 = SPIRVShaderResources::IsUsingCombinedSamplers(local_b0);
      if ((bVar1) && (UVar2 = SPIRVShaderResources::GetNumSepSmplrs(local_b0), UVar2 != 0)) {
        pcVar5 = SPIRVShaderResources::GetCombinedSamplerSuffix(local_b0);
        PipelineResourceSignatureDescWrapper::SetCombinedSamplerSuffix
                  (__return_storage_ptr__,pcVar5);
      }
      __gnu_cxx::
      __normal_iterator<const_Diligent::ShaderVkImpl_*const_*,_std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_Diligent::PipelineStateVkImpl::ShaderStageInfo_*,_std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>_>
    ::operator++(&__end1);
  }
  UniqueResources._M_h._M_single_bucket._3_1_ = 1;
  std::
  unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::SPIRVShaderResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::SPIRVShaderResourceAttribs_&>_>_>
  ::~unordered_map((unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::SPIRVShaderResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::SPIRVShaderResourceAttribs_&>_>_>
                    *)&__range1);
  if ((UniqueResources._M_h._M_single_bucket._3_1_ & 1) == 0) {
    PipelineResourceSignatureDescWrapper::~PipelineResourceSignatureDescWrapper
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

PipelineResourceSignatureDescWrapper PipelineStateVkImpl::GetDefaultResourceSignatureDesc(
    const TShaderStages&              ShaderStages,
    const char*                       PSOName,
    const PipelineResourceLayoutDesc& ResourceLayout,
    Uint32                            SRBAllocationGranularity) noexcept(false)
{
    PipelineResourceSignatureDescWrapper SignDesc{PSOName, ResourceLayout, SRBAllocationGranularity};

    std::unordered_map<ShaderResourceHashKey, const SPIRVShaderResourceAttribs&, ShaderResourceHashKey::Hasher> UniqueResources;
    for (const ShaderStageInfo& Stage : ShaderStages)
    {
        for (const ShaderVkImpl* pShader : Stage.Shaders)
        {
            const SPIRVShaderResources& ShaderResources = *pShader->GetShaderResources();
            ShaderResources.ProcessResources(
                [&](const SPIRVShaderResourceAttribs& Attribs, Uint32) //
                {
                    // We can't skip immutable samplers because immutable sampler arrays have to be defined
                    // as both resource and sampler.
                    //if (Res.Type == SPIRVShaderResourceAttribs::SeparateSampler &&
                    //    FindImmutableSampler(ResourceLayout.ImmutableSamplers, ResourceLayout.NumImmutableSamplers, Stage.Type, Res.Name,
                    //                         ShaderResources.GetCombinedSamplerSuffix()) >= 0)
                    //{
                    //    // Skip separate immutable samplers - they are not resources
                    //    return;
                    //}

                    const char* const SamplerSuffix =
                        (ShaderResources.IsUsingCombinedSamplers() && Attribs.Type == SPIRVShaderResourceAttribs::ResourceType::SeparateSampler) ?
                        ShaderResources.GetCombinedSamplerSuffix() :
                        nullptr;

                    const ShaderResourceVariableDesc VarDesc = FindPipelineResourceLayoutVariable(ResourceLayout, Attribs.Name, Stage.Type, SamplerSuffix);
                    // Note that Attribs.Name != VarDesc.Name for combined samplers
                    const auto it_assigned = UniqueResources.emplace(ShaderResourceHashKey{VarDesc.ShaderStages, Attribs.Name}, Attribs);
                    if (it_assigned.second)
                    {
                        if (Attribs.ArraySize == 0)
                        {
                            LOG_ERROR_AND_THROW("Resource '", Attribs.Name, "' in shader '", pShader->GetDesc().Name, "' is a runtime-sized array. ",
                                                "You must use explicit resource signature to specify the array size.");
                        }

                        const SHADER_RESOURCE_TYPE    ResType = SPIRVShaderResourceAttribs::GetShaderResourceType(Attribs.Type);
                        const PIPELINE_RESOURCE_FLAGS Flags   = SPIRVShaderResourceAttribs::GetPipelineResourceFlags(Attribs.Type) | ShaderVariableFlagsToPipelineResourceFlags(VarDesc.Flags);
                        SignDesc.AddResource(VarDesc.ShaderStages, Attribs.Name, Attribs.ArraySize, ResType, VarDesc.Type, Flags);
                    }
                    else
                    {
                        VerifyResourceMerge(PSOName, it_assigned.first->second, Attribs);
                    }
                });

            // Merge combined sampler suffixes
            if (ShaderResources.IsUsingCombinedSamplers() && ShaderResources.GetNumSepSmplrs() > 0)
            {
                SignDesc.SetCombinedSamplerSuffix(ShaderResources.GetCombinedSamplerSuffix());
            }
        }
    }

    return SignDesc;
}